

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O1

void __thiscall
RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
::RandomWordTestData
          (RandomWordTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
           *this,basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                 *in_delim,size_t in_fixed_word_count,size_t in_fixed_word_length)

{
  pointer pcVar1;
  
  (this->m_delim)._M_dataplus._M_p = (pointer)&(this->m_delim).field_2;
  pcVar1 = (in_delim->_M_dataplus)._M_p;
  std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>
  ::_M_construct<signed_char*>
            ((basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>> *)
             this,pcVar1,pcVar1 + in_delim->_M_string_length);
  this->m_fixed_word_count = in_fixed_word_count;
  this->m_fixed_word_length = in_fixed_word_length;
  (this->m_str)._M_dataplus._M_p = (pointer)&(this->m_str).field_2;
  (this->m_str)._M_string_length = 0;
  (this->m_str).field_2._M_local_buf[0] = '\0';
  (this->m_tokens).
  super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tokens).
  super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tokens).
  super__Vector_base<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_token_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_token_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_token_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  populate(this);
  return;
}

Assistant:

RandomWordTestData(StringT in_delim, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
	: m_delim{ in_delim },
	m_fixed_word_count{ in_fixed_word_count },
	m_fixed_word_length{ in_fixed_word_length } {
		populate();
	}